

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

Simplex_handle __thiscall
Gudhi::Simplex_tree<Low_options>::find_simplex
          (Simplex_tree<Low_options> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *simplex)

{
  node_ptr pcVar1;
  undefined8 *in_RDX;
  node_ptr pcVar2;
  pointer *ppuVar3;
  uchar *key;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<std::less<unsigned_char>,_boost::container::dtl::select1st<const_unsigned_char>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_40;
  node_ptr local_38;
  
  key = (uchar *)*in_RDX;
  ppuVar3 = &simplex[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_40.traits_ =
       (bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
        *)ppuVar3;
  local_38 = (node_ptr)ppuVar3;
  pcVar1 = boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
           find<unsigned_char,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<std::less<unsigned_char>,boost::container::dtl::select1st<unsigned_char_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<unsigned_char_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<unsigned_char_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>,void*,(boost::container::tree_type_enum)0,true>>>>
                     (&local_38,key,&local_40);
  if (pcVar1 != (node_ptr)ppuVar3) {
    do {
      key = key + 1;
      if (key == (uchar *)in_RDX[1]) goto LAB_0015b117;
      if (pcVar1 == (node_ptr)0x0) {
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const unsigned char, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const unsigned char, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                     );
      }
      if (*(char *)&(pcVar1[2].left_)->left_ != *(char *)&pcVar1[1].parent_) break;
      pcVar2 = pcVar1[2].left_ + 1;
      local_40.traits_ =
           (bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
            *)pcVar2;
      local_38 = pcVar2;
      pcVar1 = boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>
               ::
               find<unsigned_char,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<std::less<unsigned_char>,boost::container::dtl::select1st<unsigned_char_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<unsigned_char_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<unsigned_char_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>>>,void*,(boost::container::tree_type_enum)0,true>>>>
                         (&local_38,key,&local_40);
    } while (pcVar1 != pcVar2);
  }
  pcVar1 = (node_ptr)0x0;
LAB_0015b117:
  (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)pcVar1;
  return (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
            )this;
}

Assistant:

Simplex_handle find_simplex(const std::vector<Vertex_handle> & simplex) const {
    Siblings const* tmp_sib = &root_;
    Dictionary_const_it tmp_dit;
    auto vi = simplex.begin();
    if constexpr (Options::contiguous_vertices && !Options::stable_simplex_handles) {
      // Equivalent to the first iteration of the normal loop
      GUDHI_CHECK(contiguous_vertices(), "non-contiguous vertices");
      Vertex_handle v = *vi++;
      if(v < 0 || v >= static_cast<Vertex_handle>(root_.members_.size()))
        return null_simplex();
      tmp_dit = root_.members_.begin() + v;
      if (vi == simplex.end())
        return tmp_dit;
      if (!has_children(tmp_dit))
        return null_simplex();
      tmp_sib = tmp_dit->second.children();
    }
    for (;;) {
      tmp_dit = tmp_sib->members_.find(*vi++);
      if (tmp_dit == tmp_sib->members_.end())
        return null_simplex();
      if (vi == simplex.end())
        return tmp_dit;
      if (!has_children(tmp_dit))
        return null_simplex();
      tmp_sib = tmp_dit->second.children();
    }
  }